

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O3

void csp_send_direct_iface
               (csp_id_t_conflict *idout,csp_packet_t *packet,csp_iface_t *iface,uint16_t via,
               int from_me)

{
  ushort uVar1;
  uint16_t uVar2;
  byte bVar3;
  int iVar4;
  
  csp_output_hook(idout,packet,iface,via,from_me);
  if (&packet->id != (csp_id_t *)idout) {
    (packet->id).pri = idout->pri;
    uVar2 = idout->dst;
    (packet->id).src = idout->src;
    (packet->id).dst = uVar2;
    (packet->id).dport = idout->dport;
    (packet->id).sport = idout->sport;
    (packet->id).flags = idout->flags;
  }
  if (from_me != 0) {
    bVar3 = idout->flags;
    if ((bVar3 & 8) != 0) {
      iVar4 = csp_hmac_append(packet,false);
      if (iVar4 != 0) goto LAB_00108397;
      bVar3 = idout->flags;
    }
    if (((bVar3 & 1) != 0) && (iVar4 = csp_crc32_append(packet), iVar4 != 0)) goto LAB_00108397;
    if (iface != &csp_if_lo) {
      csp_promisc_add(packet);
    }
  }
  uVar1 = packet->length;
  iVar4 = (*iface->nexthop)(iface,via,packet,from_me);
  if (iVar4 == 0) {
    iface->tx = iface->tx + 1;
    iface->txbytes = iface->txbytes + (uint)uVar1;
    return;
  }
LAB_00108397:
  csp_buffer_free(packet);
  iface->tx_error = iface->tx_error + 1;
  return;
}

Assistant:

void csp_send_direct_iface(csp_id_t* idout, csp_packet_t * packet, csp_iface_t * iface, uint16_t via, int from_me) {

	csp_output_hook(idout, packet, iface, via, from_me);

	/* Copy identifier to packet (before crc and hmac) */
	if(idout != &packet->id) {
		csp_id_copy(&packet->id, idout);
	}


	/* Only encrypt packets from the current node */
	if (from_me) {
		/* Append HMAC */
		if (idout->flags & CSP_FHMAC) {
#if (CSP_USE_HMAC)
			/* Calculate and add HMAC (does not include header for backwards compatability with csp1.x) */
			if (csp_hmac_append(packet, false) != CSP_ERR_NONE) {
				/* HMAC append failed */
				goto tx_err;
			}
#else
			csp_dbg_errno = CSP_DBG_ERR_UNSUPPORTED;
			goto tx_err;
#endif
		}

		/* Append CRC32 */
		if (idout->flags & CSP_FCRC32) {
			/* Calculate and add CRC32 (does not include header for backwards compatability with csp1.x) */
			if (csp_crc32_append(packet) != CSP_ERR_NONE) {
				/* CRC32 append failed */
				goto tx_err;
			}
		}

#if (CSP_USE_PROMISC)
		/* Loopback traffic is added to promisc queue by the router */
		if (iface != &csp_if_lo) {
			csp_promisc_add(packet);
		}
#endif
	}

	/* Store length before passing to interface */
	uint16_t bytes = packet->length;

	if ((*iface->nexthop)(iface, via, packet, from_me) != CSP_ERR_NONE)
		goto tx_err;

	iface->tx++;
	iface->txbytes += bytes;

	return;

tx_err:
	csp_buffer_free(packet);
	iface->tx_error++;
	return;
}